

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void mbedtls_md5_update(mbedtls_md5_context *ctx,uchar *input,size_t ilen)

{
  ulong __n;
  uint local_2c;
  uint32_t left;
  size_t fill;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_md5_context *ctx_local;
  
  if (ilen != 0) {
    local_2c = ctx->total[0] & 0x3f;
    __n = (ulong)(0x40 - local_2c);
    ctx->total[0] = (uint)ilen + ctx->total[0];
    ctx->total[0] = ctx->total[0];
    if (ctx->total[0] < (uint)ilen) {
      ctx->total[1] = ctx->total[1] + 1;
    }
    fill = ilen;
    ilen_local = (size_t)input;
    if ((local_2c != 0) && (__n <= ilen)) {
      memcpy(ctx->buffer + local_2c,input,__n);
      mbedtls_md5_process(ctx,ctx->buffer);
      ilen_local = (size_t)(input + __n);
      fill = ilen - __n;
      local_2c = 0;
    }
    for (; 0x3f < fill; fill = fill - 0x40) {
      mbedtls_md5_process(ctx,(uchar *)ilen_local);
      ilen_local = ilen_local + 0x40;
    }
    if (fill != 0) {
      memcpy(ctx->buffer + local_2c,(void *)ilen_local,fill);
    }
  }
  return;
}

Assistant:

void mbedtls_md5_update( mbedtls_md5_context *ctx, const unsigned char *input, size_t ilen )
{
    size_t fill;
    uint32_t left;

    if( ilen == 0 )
        return;

    left = ctx->total[0] & 0x3F;
    fill = 64 - left;

    ctx->total[0] += (uint32_t) ilen;
    ctx->total[0] &= 0xFFFFFFFF;

    if( ctx->total[0] < (uint32_t) ilen )
        ctx->total[1]++;

    if( left && ilen >= fill )
    {
        memcpy( (void *) (ctx->buffer + left), input, fill );
        mbedtls_md5_process( ctx, ctx->buffer );
        input += fill;
        ilen  -= fill;
        left = 0;
    }

    while( ilen >= 64 )
    {
        mbedtls_md5_process( ctx, input );
        input += 64;
        ilen  -= 64;
    }

    if( ilen > 0 )
    {
        memcpy( (void *) (ctx->buffer + left), input, ilen );
    }
}